

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ditFrameworkTests.cpp
# Opt level: O1

IterateResult __thiscall dit::anon_unknown_0::CaseListParserCase::iterate(CaseListParserCase *this)

{
  MatchCase *pMVar1;
  undefined1 auVar2 [8];
  bool bVar3;
  bool bVar4;
  int iVar5;
  size_t sVar6;
  TestError *this_00;
  char *pcVar7;
  long lVar8;
  CaseListFilter *pCVar9;
  long lVar10;
  MovePtr<tcu::CaseListFilter,_de::DefaultDeleter<tcu::CaseListFilter>_> caseListFilter;
  char *argv [3];
  CommandLine cmdLine;
  int local_22c;
  UniqueBase<tcu::CaseListFilter,_de::DefaultDeleter<tcu::CaseListFilter>_> local_228;
  CaseListParserCase *local_218;
  CaseListFilter *local_210;
  undefined1 local_208 [8];
  char *local_200;
  char *local_1f8;
  ios_base local_190 [264];
  CommandLine local_88;
  
  pCVar9 = (CaseListFilter *)((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  tcu::CommandLine::CommandLine(&local_88);
  local_228.m_data.ptr = (CaseListFilter *)0x0;
  local_208 = (undefined1  [8])pCVar9;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_200);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_200,"Input:\n\"",8);
  pcVar7 = this->m_caseList;
  if (pcVar7 == (char *)0x0) {
    std::ios::clear((int)&local_200 + (int)*(undefined8 *)(local_200 + -0x18));
  }
  else {
    sVar6 = strlen(pcVar7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_200,pcVar7,sVar6);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_200,"\"",1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_208,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_200);
  std::ios_base::~ios_base(local_190);
  local_208 = (undefined1  [8])0x220cae;
  local_200 = "--deqp-caselist";
  local_1f8 = this->m_caseList;
  bVar3 = tcu::CommandLine::parse(&local_88,3,(char **)local_208);
  if (!bVar3) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Failed to parse command line",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/internal/ditFrameworkTests.cpp"
               ,0x66);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  tcu::CommandLine::createCaseListFilter
            ((MovePtr<tcu::CaseListFilter,_de::DefaultDeleter<tcu::CaseListFilter>_> *)local_208,
             &local_88,((this->super_TestCase).super_TestNode.m_testCtx)->m_curArchive);
  auVar2 = local_208;
  local_208 = (undefined1  [8])0x0;
  if ((undefined1  [8])local_228.m_data.ptr != auVar2) {
    de::details::UniqueBase<tcu::CaseListFilter,_de::DefaultDeleter<tcu::CaseListFilter>_>::reset
              (&local_228);
    local_228.m_data.ptr = (CaseListFilter *)auVar2;
  }
  de::details::UniqueBase<tcu::CaseListFilter,_de::DefaultDeleter<tcu::CaseListFilter>_>::reset
            ((UniqueBase<tcu::CaseListFilter,_de::DefaultDeleter<tcu::CaseListFilter>_> *)local_208)
  ;
  iVar5 = this->m_numSubCases;
  if (iVar5 < 1) {
    local_22c = 0;
  }
  else {
    lVar8 = 0;
    lVar10 = 0;
    local_22c = 0;
    local_218 = this;
    local_210 = pCVar9;
    do {
      pMVar1 = this->m_subCases;
      local_208 = (undefined1  [8])pCVar9;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_200);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_200,"Checking \"",10);
      pcVar7 = *(char **)((long)&pMVar1->path + lVar8);
      if (pcVar7 == (char *)0x0) {
        std::ios::clear((int)&local_200 + (int)*(undefined8 *)(local_200 + -0x18));
      }
      else {
        sVar6 = strlen(pcVar7);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_200,pcVar7,sVar6);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_200,"\"",1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_200,", expecting ",0xc);
      pcVar7 = *(char **)((anonymous_namespace)::
                          getMatchCaseExpectedDesc(dit::(anonymous_namespace)::MatchCase::Expected)
                          ::descs + (long)*(int *)((long)&pMVar1->expected + lVar8) * 8);
      sVar6 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_200,pcVar7,sVar6);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_208,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_200);
      std::ios_base::~ios_base(local_190);
      bVar3 = tcu::CaseListFilter::checkTestGroupName
                        (local_228.m_data.ptr,*(char **)((long)&pMVar1->path + lVar8));
      bVar4 = tcu::CaseListFilter::checkTestCaseName
                        (local_228.m_data.ptr,*(char **)((long)&pMVar1->path + lVar8));
      pCVar9 = local_210;
      iVar5 = *(int *)((long)&pMVar1->expected + lVar8);
      if ((bVar3 == (iVar5 != 1)) || (bVar4 == (iVar5 != 2))) {
        local_208 = (undefined1  [8])local_210;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_200);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_200,"   FAIL!",8);
        this = local_218;
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_208,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_200);
        std::ios_base::~ios_base(local_190);
      }
      else {
        local_208 = (undefined1  [8])local_210;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_200);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_200,"   pass",7);
        this = local_218;
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_208,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_200);
        std::ios_base::~ios_base(local_190);
        local_22c = local_22c + 1;
      }
      lVar10 = lVar10 + 1;
      iVar5 = this->m_numSubCases;
      lVar8 = lVar8 + 0x10;
    } while (lVar10 < iVar5);
  }
  pcVar7 = "All passed";
  if (local_22c != iVar5) {
    pcVar7 = "Unexpected match result";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestNode.m_testCtx,(uint)(local_22c != iVar5),pcVar7);
  de::details::UniqueBase<tcu::CaseListFilter,_de::DefaultDeleter<tcu::CaseListFilter>_>::reset
            (&local_228);
  tcu::CommandLine::~CommandLine(&local_88);
  return STOP;
}

Assistant:

IterateResult iterate (void)
	{
		TestLog&							log		= m_testCtx.getLog();
		tcu::CommandLine					cmdLine;
		de::MovePtr<tcu::CaseListFilter>	caseListFilter;
		int									numPass	= 0;

		log << TestLog::Message << "Input:\n\"" << m_caseList << "\"" << TestLog::EndMessage;

		{
			const char* argv[] =
			{
				"deqp",
				"--deqp-caselist",
				m_caseList
			};

			if (!cmdLine.parse(DE_LENGTH_OF_ARRAY(argv), argv))
				TCU_FAIL("Failed to parse command line");
		}

		caseListFilter = cmdLine.createCaseListFilter(m_testCtx.getArchive());

		for (int subCaseNdx = 0; subCaseNdx < m_numSubCases; subCaseNdx++)
		{
			const MatchCase&	curCase		= m_subCases[subCaseNdx];
			bool				matchGroup;
			bool				matchCase;

			log << TestLog::Message << "Checking \"" << curCase.path << "\""
									<< ", expecting " << getMatchCaseExpectedDesc(curCase.expected)
				<< TestLog::EndMessage;

			matchGroup	= caseListFilter->checkTestGroupName(curCase.path);
			matchCase	= caseListFilter->checkTestCaseName(curCase.path);

			if ((matchGroup	== (curCase.expected == MatchCase::MATCH_GROUP)) &&
				(matchCase	== (curCase.expected == MatchCase::MATCH_CASE)))
			{
				log << TestLog::Message << "   pass" << TestLog::EndMessage;
				numPass += 1;
			}
			else
				log << TestLog::Message << "   FAIL!" << TestLog::EndMessage;
		}

		m_testCtx.setTestResult((numPass == m_numSubCases) ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
								(numPass == m_numSubCases) ? "All passed"			: "Unexpected match result");

		return STOP;
	}